

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void * libdeflate_aligned_malloc(size_t alignment,size_t size)

{
  void *pvVar1;
  long in_RDI;
  void *orig_ptr;
  void *ptr;
  void *local_18;
  
  pvVar1 = libdeflate_malloc(0x9b5ab5);
  local_18 = pvVar1;
  if (pvVar1 != (void *)0x0) {
    local_18 = (void *)((long)pvVar1 + in_RDI + 7 & (in_RDI - 1U ^ 0xffffffffffffffff));
    *(void **)((long)local_18 + -8) = pvVar1;
  }
  return local_18;
}

Assistant:

void *
libdeflate_aligned_malloc(size_t alignment, size_t size)
{
	void *ptr = libdeflate_malloc(sizeof(void *) + alignment - 1 + size);
	if (ptr) {
		void *orig_ptr = ptr;
		ptr = (void *)ALIGN((uintptr_t)ptr + sizeof(void *), alignment);
		((void **)ptr)[-1] = orig_ptr;
	}
	return ptr;
}